

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

Range<float,_3> * __thiscall
Nova::Grid<float,_3>::Cell_Domain
          (Range<float,_3> *__return_storage_ptr__,Grid<float,_3> *this,T_INDEX *index)

{
  Vector<float,_3,_true> data_copy;
  TV corner;
  Vector<float,_3,_true> local_50;
  Vector<float,_3,_true> local_40;
  Vector<float,_3,_true> local_34;
  
  Vector<float,_3,_true>::Vector<int>(&local_34,index);
  local_50._data._M_elems[2] = local_34._data._M_elems[2];
  local_50._data._M_elems[0] = local_34._data._M_elems[0];
  local_50._data._M_elems[1] = local_34._data._M_elems[1];
  Vector<float,_3,_true>::operator*=(&local_50,&this->dX);
  local_40._data._M_elems._0_8_ = *(undefined8 *)(this->domain).min_corner._data._M_elems;
  local_40._data._M_elems[2] = (this->domain).min_corner._data._M_elems[2];
  Vector<float,_3,_true>::operator+=(&local_40,&local_50);
  local_50._data._M_elems[2] = local_40._data._M_elems[2];
  local_50._data._M_elems[0] = local_40._data._M_elems[0];
  local_50._data._M_elems[1] = local_40._data._M_elems[1];
  Vector<float,_3,_true>::operator-=(&local_50,&this->dX);
  *(undefined8 *)(__return_storage_ptr__->min_corner)._data._M_elems = local_50._data._M_elems._0_8_
  ;
  (__return_storage_ptr__->min_corner)._data._M_elems[2] = local_50._data._M_elems[2];
  *(undefined8 *)(__return_storage_ptr__->max_corner)._data._M_elems = local_40._data._M_elems._0_8_
  ;
  (__return_storage_ptr__->max_corner)._data._M_elems[2] = local_40._data._M_elems[2];
  return __return_storage_ptr__;
}

Assistant:

Range<T,d> Cell_Domain(const T_INDEX& index) const
    {
        TV corner=domain.min_corner+TV(index)*dX;
        return Range<T,d>(corner-dX,corner);
    }